

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>::
find<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Entry,capnp::_::RawSchema*&>
          (HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>
           *this,ArrayPtr<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>
                 table,RawSchema **params)

{
  long lVar1;
  uint uVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  Entry *pEVar4;
  ulong uVar5;
  ulong uVar6;
  long *in_R8;
  uint uVar7;
  uint *puVar8;
  Maybe<unsigned_long> MVar9;
  
  pEVar4 = table.ptr;
  aVar3.value = table.size_;
  if (pEVar4[1].key.super_StringPtr.content.ptr != (char *)0x0) {
    uVar2 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,(RawSchema *)*in_R8);
    lVar1 = *(long *)&pEVar4->value;
    aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(pEVar4 + 1))->value;
    uVar5 = (ulong)((int)aVar3.value - 1U & uVar2);
    uVar7 = *(uint *)(lVar1 + 4 + uVar5 * 8);
    if (uVar7 != 0) {
      puVar8 = (uint *)(lVar1 + uVar5 * 8);
      do {
        if (((uVar7 != 1) && (*puVar8 == uVar2)) &&
           (*(long *)(table.size_ + (ulong)(uVar7 - 2) * 0x28) == *in_R8)) {
          *this = (HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = (ulong)(uVar7 - 2);
          goto LAB_001851f0;
        }
        uVar6 = uVar5 + 1;
        uVar5 = uVar6 & 0xffffffff;
        if (uVar6 == aVar3.value) {
          uVar5 = 0;
        }
        puVar8 = (uint *)(lVar1 + uVar5 * 8);
        uVar7 = puVar8[1];
      } while (uVar7 != 0);
    }
  }
  *this = (HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>)
          0x0;
LAB_001851f0:
  MVar9.ptr.field_1.value = aVar3.value;
  MVar9.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar9.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }